

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O2

Vec_Ptr_t * Ptr_AbcDeriveNtk(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *p;
  Vec_Ptr_t *pVVar1;
  
  p = Vec_PtrAllocExact(5);
  Vec_PtrPush(p,pNtk->pName);
  pVVar1 = Ptr_AbcDeriveInputs(pNtk);
  Vec_PtrPush(p,pVVar1);
  pVVar1 = Ptr_AbcDeriveOutputs(pNtk);
  Vec_PtrPush(p,pVVar1);
  pVVar1 = Vec_PtrAllocExact(0);
  Vec_PtrPush(p,pVVar1);
  pVVar1 = Ptr_AbcDeriveBoxes(pNtk);
  Vec_PtrPush(p,pVVar1);
  Ptr_CheckArray(p);
  return p;
}

Assistant:

Vec_Ptr_t * Ptr_AbcDeriveNtk( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNtk = Vec_PtrAllocExact( 5 );
    Vec_PtrPush( vNtk, Abc_NtkName(pNtk) );
    Vec_PtrPush( vNtk, Ptr_AbcDeriveInputs(pNtk) );
    Vec_PtrPush( vNtk, Ptr_AbcDeriveOutputs(pNtk) );
    Vec_PtrPush( vNtk, Vec_PtrAllocExact(0) );
    Vec_PtrPush( vNtk, Ptr_AbcDeriveBoxes(pNtk) );
    assert( Ptr_CheckArray(vNtk) );
    return vNtk;
}